

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O0

XMLNode * __thiscall
ORPG::Core::XMLNode::insert_before_node(XMLNode *this,XMLNode *before,XMLNode *insert)

{
  XMLNode *pXVar1;
  XMLDocument *pXVar2;
  XMLDocument *pXVar3;
  XMLNode *tmp;
  XMLNode *insert_local;
  XMLNode *before_local;
  XMLNode *this_local;
  
  if (insert == (XMLNode *)0x0) {
    this_local = (XMLNode *)0x0;
  }
  else if (before == (XMLNode *)0x0) {
    this_local = (XMLNode *)0x0;
  }
  else {
    pXVar2 = get_document(insert);
    pXVar3 = get_document(this);
    if (pXVar2 == pXVar3) {
      pXVar2 = get_document(before);
      pXVar3 = get_document(this);
      if (pXVar2 == pXVar3) {
        this_local = insert;
        if (before->nextSib == (XMLNode *)0x0) {
          before->nextSib = insert;
        }
        else {
          pXVar1 = before->prevSib;
          before->prevSib = insert;
          insert->prevSib = pXVar1;
        }
      }
      else {
        this_local = (XMLNode *)0x0;
      }
    }
    else {
      this_local = (XMLNode *)0x0;
    }
  }
  return this_local;
}

Assistant:

XMLNode* XMLNode::insert_before_node(XMLNode* before, XMLNode* insert) {
    if(insert == nullptr) return 0;
    if(before == nullptr) return 0;

    if(insert->get_document() != this->get_document()) return 0;
    if(before->get_document() != this->get_document()) return 0;

    if(before->nextSib == nullptr) {
        before->nextSib = insert;
    } else {
        //TODO Query to ensure the node doesn't already exist
        //Create a temporary pointer to help with the insert
        XMLNode* tmp = before->prevSib;
        before->prevSib = insert;
        insert->prevSib = tmp;
    }

    return insert;
}